

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

int make_canonical(ly_ctx *ctx,int type,char **value,void *data1,void *data2)

{
  byte bVar1;
  undefined8 *puVar2;
  bool bVar3;
  char **ppcVar4;
  ly_ctx *ctx_00;
  int iVar5;
  int iVar6;
  int iVar7;
  lyxp_expr *expr;
  uint16_t *puVar8;
  size_t sVar9;
  ulong uVar10;
  char *pcVar11;
  char *pcVar12;
  char cVar13;
  undefined8 uVar14;
  char *pcVar15;
  uint uVar16;
  long lVar17;
  ulong uVar18;
  undefined8 uStack_260;
  uint local_258 [130];
  char *local_50;
  lyxp_expr *local_48;
  char **local_40;
  ly_ctx *local_38;
  
  iVar6 = 0;
  local_40 = value;
  local_38 = ctx;
  switch(type) {
  case 2:
    iVar6 = *data2;
    local_258[0] = local_258[0] & 0xffffff00;
    if (0 < (long)iVar6) {
      lVar17 = 0;
      do {
        puVar2 = *(undefined8 **)((long)data1 + lVar17 * 8);
        if (puVar2 != (undefined8 *)0x0) {
          if ((char)local_258[0] == '\0') {
            uStack_260 = 0x1260d9;
            strcpy((char *)local_258,(char *)*puVar2);
          }
          else {
            uStack_260 = 0x1260ae;
            sVar9 = strlen((char *)local_258);
            uStack_260 = 0x1260cb;
            sprintf((char *)((long)local_258 + sVar9)," %s",*puVar2);
          }
        }
        lVar17 = lVar17 + 1;
      } while (iVar6 != lVar17);
    }
    break;
  default:
    goto switchD_00125fc3_caseD_3;
  case 4:
    lVar17 = *data1;
    if (lVar17 == 0) {
      local_258[0] = 0x302e30;
    }
    else {
      bVar1 = *data2;
      uStack_260 = 0x126111;
      iVar6 = sprintf((char *)local_258,"%ld ",lVar17);
      if (iVar6 + -1 <= (int)(uint)bVar1 && 0 < lVar17 || iVar6 + -2 <= (int)(uint)bVar1) {
        uStack_260 = 0x126156;
        iVar6 = sprintf((char *)local_258,"%0*ld ",(ulong)((lVar17 < 1) + 1 + (uint)bVar1),lVar17);
      }
      if (bVar1 != 0) {
        pcVar11 = (char *)((long)local_258 + (long)iVar6 + -1);
        bVar3 = true;
        uVar16 = 0;
        do {
          if (bVar1 - 1 == uVar16 || !bVar3) {
            cVar13 = pcVar11[-1];
LAB_00126196:
            *pcVar11 = cVar13;
            bVar3 = false;
          }
          else {
            cVar13 = pcVar11[-1];
            if (cVar13 != '0') goto LAB_00126196;
            *pcVar11 = '\0';
            bVar3 = true;
          }
          pcVar11 = pcVar11 + -1;
          uVar16 = uVar16 + 1;
        } while (bVar1 != uVar16);
        iVar6 = iVar6 - uVar16;
      }
      *(undefined1 *)((long)local_258 + (long)iVar6 + -1) = 0x2e;
    }
    break;
  case 7:
    pcVar11 = *value;
    uStack_260 = 0x12605a;
    pcVar15 = strchr(pcVar11,0x3a);
    if (pcVar15 == (char *)0x0) {
      uStack_260 = 0x1263bf;
      sprintf((char *)local_258,"%s:%s",data1,pcVar11);
    }
    else {
      uStack_260 = 0x126072;
      strcpy((char *)local_258,pcVar11);
    }
    break;
  case 8:
    uStack_260 = 0x1261c4;
    expr = lyxp_parse_expr(ctx,*value);
    if (expr == (lyxp_expr *)0x0) {
      uStack_260 = 0x1263fa;
      ly_log(ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
             ,0x404);
      return 0;
    }
    if (expr->used == 0) {
      uVar16 = 0;
    }
    else {
      puVar8 = expr->tok_len;
      uVar10 = 0;
      uVar18 = 0;
      pcVar11 = (char *)0x0;
      local_48 = expr;
      do {
        pcVar15 = expr->expr + expr->expr_pos[uVar10];
        if ((uVar10 != 0) &&
           (pcVar12 = expr->expr + (ulong)expr->expr_pos[uVar10 - 1] + (ulong)puVar8[uVar10 - 1],
           pcVar12 != pcVar15)) {
          iVar6 = (int)uVar18;
          uVar18 = ((long)pcVar15 - (long)pcVar12) + (long)iVar6;
          if (0x1ff < (long)uVar18) {
            uVar14 = 0x40e;
            goto LAB_0012645e;
          }
          uStack_260 = 0x126242;
          strncpy((char *)((long)local_258 + (long)iVar6),pcVar12,(long)pcVar15 - (long)pcVar12);
          puVar8 = expr->tok_len;
        }
        iVar6 = (int)uVar18;
        if (expr->tokens[uVar10] == LYXP_TOKEN_NAMETEST) {
          uStack_260 = 0x126262;
          pcVar12 = strnchr(pcVar15,0x3a,(uint)puVar8[uVar10]);
          if (pcVar12 == (char *)0x0) {
            puVar8 = expr->tok_len;
            goto LAB_001262c8;
          }
          local_50 = pcVar12 + 1;
          iVar5 = (int)local_50 - (int)pcVar15;
          if (pcVar11 == (char *)0x0) {
LAB_00126291:
            if (0x1ff < iVar6 + iVar5) {
              uStack_260 = 0x1264c7;
              ly_log(local_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                     ,0x41e);
              expr = local_48;
              goto LAB_00126468;
            }
            uStack_260 = 0x1262be;
            strncpy((char *)((long)local_258 + (long)iVar6),pcVar15,(long)iVar5);
            iVar6 = iVar6 + iVar5;
          }
          else {
            uStack_260 = 0x12628a;
            iVar7 = strncmp(pcVar15,pcVar11,(long)iVar5);
            if (iVar7 != 0) goto LAB_00126291;
          }
          expr = local_48;
          sVar9 = (ulong)local_48->tok_len[uVar10] - (long)iVar5;
          if (0x1ff < (int)sVar9 + iVar6) {
            uStack_260 = 0x12649a;
            ly_log(local_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                   ,0x429);
            goto LAB_00126468;
          }
          uStack_260 = 0x12634b;
          strncpy((char *)((long)local_258 + (long)iVar6),local_50,sVar9);
          puVar8 = expr->tok_len;
          uVar16 = (iVar6 - iVar5) + (uint)puVar8[uVar10];
          pcVar11 = pcVar15;
        }
        else {
LAB_001262c8:
          if (0x1ff < (int)(iVar6 + (uint)puVar8[uVar10])) {
            uVar14 = 0x431;
            goto LAB_0012645e;
          }
          uStack_260 = 0x1262fc;
          strncpy((char *)((long)local_258 + (long)iVar6),expr->expr + expr->expr_pos[uVar10],
                  (ulong)puVar8[uVar10]);
          puVar8 = expr->tok_len;
          uVar16 = (uint)puVar8[uVar10] + iVar6;
        }
        uVar18 = (ulong)uVar16;
        uVar10 = uVar10 + 1;
      } while (uVar10 < expr->used);
      if (0x1ff < (int)uVar16) {
        uVar14 = 0x43a;
LAB_0012645e:
        uStack_260 = 0x126465;
        ly_log(local_38,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
               "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
               ,uVar14);
LAB_00126468:
        uStack_260 = 0x12646d;
        lyxp_expr_free(expr);
        return 0;
      }
    }
    *(undefined1 *)((long)local_258 + (long)(int)uVar16) = 0;
    uStack_260 = 0x126415;
    lyxp_expr_free(expr);
    break;
  case 0xc:
  case 0xe:
  case 0x10:
  case 0x12:
    uVar14 = *data1;
    pcVar11 = "%ld";
    goto LAB_00125fdd;
  case 0xd:
  case 0xf:
  case 0x11:
  case 0x13:
    uVar14 = *data1;
    pcVar11 = "%lu";
LAB_00125fdd:
    uStack_260 = 0x125feb;
    sprintf((char *)local_258,pcVar11,uVar14);
  }
  ppcVar4 = local_40;
  pcVar11 = *local_40;
  uStack_260 = 0x126001;
  iVar5 = strcmp((char *)local_258,pcVar11);
  ctx_00 = local_38;
  iVar6 = 0;
  if (iVar5 != 0) {
    uStack_260 = 0x126019;
    lydict_remove(local_38,pcVar11);
    uStack_260 = 0x12602a;
    pcVar11 = lydict_insert(ctx_00,(char *)local_258,0);
    *ppcVar4 = pcVar11;
    iVar6 = 1;
  }
switchD_00125fc3_caseD_3:
  return iVar6;
}

Assistant:

static int
make_canonical(struct ly_ctx *ctx, int type, const char **value, void *data1, void *data2)
{
    const uint16_t buf_len = 511;
    char buf[buf_len + 1];
    struct lys_type_bit **bits = NULL;
    struct lyxp_expr *exp;
    const char *module_name, *cur_expr, *end;
    int i, j, count;
    int64_t num;
    uint64_t unum;
    uint8_t c;

    switch (type) {
    case LY_TYPE_BITS:
        bits = (struct lys_type_bit **)data1;
        count = *((int *)data2);
        /* in canonical form, the bits are ordered by their position */
        buf[0] = '\0';
        for (i = 0; i < count; i++) {
            if (!bits[i]) {
                /* bit not set */
                continue;
            }
            if (buf[0]) {
                sprintf(buf + strlen(buf), " %s", bits[i]->name);
            } else {
                strcpy(buf, bits[i]->name);
            }
        }
        break;

    case LY_TYPE_IDENT:
        module_name = (const char *)data1;
        /* identity must always have a prefix */
        if (!strchr(*value, ':')) {
            sprintf(buf, "%s:%s", module_name, *value);
        } else {
            strcpy(buf, *value);
        }
        break;

    case LY_TYPE_INST:
        exp = lyxp_parse_expr(ctx, *value);
        LY_CHECK_ERR_RETURN(!exp, LOGINT(ctx), 0);

        module_name = NULL;
        count = 0;
        for (i = 0; (unsigned)i < exp->used; ++i) {
            cur_expr = &exp->expr[exp->expr_pos[i]];

            /* copy WS */
            if (i && ((end = exp->expr + exp->expr_pos[i - 1] + exp->tok_len[i - 1]) != cur_expr)) {
                if (count + (cur_expr - end) > buf_len) {
                    LOGINT(ctx);
                    lyxp_expr_free(exp);
                    return 0;
                }
                strncpy(&buf[count], end, cur_expr - end);
                count += cur_expr - end;
            }

            if ((exp->tokens[i] == LYXP_TOKEN_NAMETEST) && (end = strnchr(cur_expr, ':', exp->tok_len[i]))) {
                /* get the module name with ":" */
                ++end;
                j = end - cur_expr;

                if (!module_name || strncmp(cur_expr, module_name, j)) {
                    /* print module name with colon, it does not equal to the parent one */
                    if (count + j > buf_len) {
                        LOGINT(ctx);
                        lyxp_expr_free(exp);
                        return 0;
                    }
                    strncpy(&buf[count], cur_expr, j);
                    count += j;
                }
                module_name = cur_expr;

                /* copy the rest */
                if (count + (exp->tok_len[i] - j) > buf_len) {
                    LOGINT(ctx);
                    lyxp_expr_free(exp);
                    return 0;
                }
                strncpy(&buf[count], end, exp->tok_len[i] - j);
                count += exp->tok_len[i] - j;
            } else {
                if (count + exp->tok_len[i] > buf_len) {
                    LOGINT(ctx);
                    lyxp_expr_free(exp);
                    return 0;
                }
                strncpy(&buf[count], &exp->expr[exp->expr_pos[i]], exp->tok_len[i]);
                count += exp->tok_len[i];
            }
        }
        if (count > buf_len) {
            LOGINT(ctx);
            lyxp_expr_free(exp);
            return 0;
        }
        buf[count] = '\0';

        lyxp_expr_free(exp);
        break;

    case LY_TYPE_DEC64:
        num = *((int64_t *)data1);
        c = *((uint8_t *)data2);
        if (num) {
            count = sprintf(buf, "%"PRId64" ", num);
            if ( (num > 0 && (count - 1) <= c)
                 || (count - 2) <= c ) {
                /* we have 0. value, print the value with the leading zeros
                 * (one for 0. and also keep the correct with of num according
                 * to fraction-digits value)
                 * for (num<0) - extra character for '-' sign */
                count = sprintf(buf, "%0*"PRId64" ", (num > 0) ? (c + 1) : (c + 2), num);
            }
            for (i = c, j = 1; i > 0 ; i--) {
                if (j && i > 1 && buf[count - 2] == '0') {
                    /* we have trailing zero to skip */
                    buf[count - 1] = '\0';
                } else {
                    j = 0;
                    buf[count - 1] = buf[count - 2];
                }
                count--;
            }
            buf[count - 1] = '.';
        } else {
            /* zero */
            sprintf(buf, "0.0");
        }
        break;

    case LY_TYPE_INT8:
    case LY_TYPE_INT16:
    case LY_TYPE_INT32:
    case LY_TYPE_INT64:
        num = *((int64_t *)data1);
        sprintf(buf, "%"PRId64, num);
        break;

    case LY_TYPE_UINT8:
    case LY_TYPE_UINT16:
    case LY_TYPE_UINT32:
    case LY_TYPE_UINT64:
        unum = *((uint64_t *)data1);
        sprintf(buf, "%"PRIu64, unum);
        break;

    default:
        /* should not be even called - just do nothing */
        return 0;
    }

    if (strcmp(buf, *value)) {
        lydict_remove(ctx, *value);
        *value = lydict_insert(ctx, buf, 0);
        return 1;
    }

    return 0;
}